

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>_>
         *this,Entry *row)

{
  size_t oldPos;
  Entry *pEVar1;
  size_t pos;
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>
  *indexObj;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
  table;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
  table_00;
  
  pEVar1 = (this->rows).builder.ptr;
  pos = ((long)row - (long)pEVar1 >> 4) * -0x3333333333333333;
  table.size_ = ((long)(this->rows).builder.pos - (long)pEVar1 >> 4) * -0x3333333333333333;
  table.ptr = pEVar1;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>
  ::
  erase<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,unsigned_int&>
            ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>
              *)&this->indexes,table,pos,&row->key);
  __return_storage_ptr__->key = row->key;
  capnp::_::RpcSystemBase::RpcConnectionState::Answer::Answer
            (&__return_storage_ptr__->value,&row->value);
  pEVar1 = (this->rows).builder.ptr;
  table_00.size_ = ((long)(this->rows).builder.pos - (long)pEVar1 >> 4) * -0x3333333333333333;
  oldPos = table_00.size_ - 1;
  if (pos - oldPos != 0) {
    table_00.ptr = pEVar1;
    HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>
    ::
    move<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,unsigned_int&>
              ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>
                *)&this->indexes,table_00,oldPos,pos,&pEVar1[oldPos].key);
    pEVar1 = (this->rows).builder.ptr + oldPos;
    row->key = pEVar1->key;
    capnp::_::RpcSystemBase::RpcConnectionState::Answer::operator=(&row->value,&pEVar1->value);
  }
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
  ::removeLast((ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
                *)this);
  return __return_storage_ptr__;
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}